

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O3

void __thiscall
tst_deprecations_helpers_qpromiseall::allPromisesSucceed_void
          (tst_deprecations_helpers_qpromiseall *this)

{
  QSharedData *pQVar1;
  long lVar2;
  long *plVar3;
  PromiseResolver<void> PVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  QPromise<void> *data;
  PromiseDataBase<void,_void_()> *this_00;
  QObject *pQVar9;
  int *piVar10;
  QEvent *this_01;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  QSharedData *pQVar14;
  ulong uVar15;
  long lVar16;
  PromiseResolver<void> resolver;
  long local_b0;
  QPromise<void> p;
  QPromise<void> local_98;
  undefined **local_88;
  PromiseDataBase<void,_void_()> *local_80;
  undefined **local_78;
  PromiseData<void> *local_70;
  QPromise<void> p1;
  QPromise<void> p0;
  
  QtPromise::resolve();
  QtPromise::resolve();
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012da30;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012d9b8;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar14 = &this_00->super_QSharedData;
  local_98.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d980;
  local_98.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,&local_98);
  local_98.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d920;
  if (&(local_98.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &((local_98.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_98.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_98.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  PVar4.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  pQVar9 = (QObject *)QThread::currentThread();
  if ((pQVar9 != (QObject *)0x0) &&
     (piVar10 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar9),
     piVar10 != (int *)0x0)) {
    if ((piVar10[1] != 0) && (cVar6 = QThread::isFinished(), cVar6 == '\0')) {
      if (piVar10[1] == 0) {
        pQVar9 = (QObject *)(QThread *)0x0;
      }
      pQVar9 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar9);
      if ((pQVar9 != (QObject *)0x0) || (cVar6 = QCoreApplication::closingDown(), cVar6 == '\0')) {
        this_01 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(this_01,None);
        *(undefined ***)this_01 = &PTR__Event_0012d728;
        *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
         (this_01 + 0x10) = PVar4.m_d.d;
        if (PVar4.m_d.d != (Data *)0x0) {
          LOCK();
          *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar9,this_01,0);
        if (piVar10 == (int *)0x0) goto LAB_00105c93;
      }
    }
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (piVar10 == (int *)0x0) {
        piVar10 = (int *)0x0;
      }
      operator_delete(piVar10);
    }
  }
LAB_00105c93:
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d980;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_88 = &PTR__QPromiseBase_0012d980;
  local_70 = p1.super_QPromiseBase<void>.m_d.d;
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78 = &PTR__QPromiseBase_0012d980;
  local_80 = this_00;
  lVar11 = QArrayData::allocate((QArrayData **)&resolver,0x10,8,3,KeepSize);
  local_b0 = 0;
  uVar15 = 0xfffffffffffffff0;
  do {
    lVar16 = local_b0 * 0x10;
    *(undefined ***)(lVar11 + lVar16) = &PTR__QPromiseBase_0012d920;
    lVar2 = *(long *)((long)&local_80 + uVar15);
    *(long *)(lVar11 + 8 + lVar16) = lVar2;
    if (lVar2 != 0) {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    *(undefined ***)(lVar16 + lVar11) = &PTR__QPromiseBase_0012d980;
    local_b0 = local_b0 + 1;
    uVar15 = uVar15 + 0x10;
  } while (uVar15 < 0x20);
  QtPromise::all<QList>((QtPromise *)&p,(QList<QtPromise::QPromise<void>_> *)&resolver);
  QArrayDataPointer<QtPromise::QPromise<void>_>::~QArrayDataPointer
            ((QArrayDataPointer<QtPromise::QPromise<void>_> *)&resolver);
  lVar11 = 0x30;
  do {
    *(undefined ***)((long)&p.super_QPromiseBase<void>._vptr_QPromiseBase + lVar11) =
         &PTR__QPromiseBase_0012d920;
    lVar2 = *(long *)((long)&p.super_QPromiseBase<void>.m_d.d + lVar11);
    if (lVar2 != 0) {
      LOCK();
      piVar10 = (int *)(lVar2 + 8);
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if ((*piVar10 == 0) &&
         (plVar3 = *(long **)((long)&p.super_QPromiseBase<void>.m_d.d + lVar11),
         plVar3 != (long *)0x0)) {
        (**(code **)(*plVar3 + 8))();
      }
    }
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != 0);
  bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  bVar7 = (bool)(~bVar7 & ((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>
                          ).m_error.m_data._M_exception_object == (void *)0x0);
  local_98.super_QPromiseBase<void>._vptr_QPromiseBase =
       (_func_int **)CONCAT71(local_98.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar7);
  resolver.m_d.d._0_1_ = 1;
  pcVar12 = QTest::toString<bool>((bool *)&local_98);
  pcVar13 = QTest::toString<bool>((bool *)&resolver);
  cVar6 = QTest::compare_helper
                    (bVar7,"Compared values are not the same",pcVar12,pcVar13,"p0.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x82);
  QVar5 = p1.super_QPromiseBase<void>.m_d;
  if (cVar6 != '\0') {
    bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      (&(p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    bVar7 = (bool)(~bVar7 & ((QVar5.d)->super_PromiseDataBase<void,_void_()>).m_error.m_data.
                            _M_exception_object == (void *)0x0);
    local_98.super_QPromiseBase<void>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(local_98.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar7);
    resolver.m_d.d._0_1_ = 1;
    pcVar12 = QTest::toString<bool>((bool *)&local_98);
    pcVar13 = QTest::toString<bool>((bool *)&resolver);
    cVar6 = QTest::compare_helper
                      (bVar7,"Compared values are not the same",pcVar12,pcVar13,"p1.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x83);
    if (cVar6 != '\0') {
      bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
      local_98.super_QPromiseBase<void>._vptr_QPromiseBase =
           (_func_int **)CONCAT71(local_98.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar7);
      resolver.m_d.d._0_1_ = 1;
      pcVar12 = QTest::toString<bool>((bool *)&local_98);
      pcVar13 = QTest::toString<bool>((bool *)&resolver);
      cVar6 = QTest::compare_helper
                        (bVar7,"Compared values are not the same",pcVar12,pcVar13,"p2.isPending()",
                         "true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0x84);
      if (cVar6 != '\0') {
        bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                          (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>
                          );
        local_98.super_QPromiseBase<void>._vptr_QPromiseBase =
             (_func_int **)
             CONCAT71(local_98.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar7);
        resolver.m_d.d._0_1_ = 1;
        pcVar12 = QTest::toString<bool>((bool *)&local_98);
        pcVar13 = QTest::toString<bool>((bool *)&resolver);
        cVar6 = QTest::compare_helper
                          (bVar7,"Compared values are not the same",pcVar12,pcVar13,"p.isPending()",
                           "true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0x85);
        if (cVar6 != '\0') {
          local_98.super_QPromiseBase<void>._vptr_QPromiseBase =
               (_func_int **)
               CONCAT44(local_98.super_QPromiseBase<void>._vptr_QPromiseBase._4_4_,0x2a);
          iVar8 = waitForValue<int>(&p,(int *)0xffffffff,(int *)&local_98);
          cVar6 = QTest::qCompare(iVar8,0x2a,"waitForValue(p, -1, 42)","42",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                  ,0x86);
          if (cVar6 != '\0') {
            bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
            bVar7 = (bool)(~bVar7 & (this_00->m_error).m_data._M_exception_object == (void *)0x0);
            local_98.super_QPromiseBase<void>._vptr_QPromiseBase =
                 (_func_int **)
                 CONCAT71(local_98.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar7);
            resolver.m_d.d._0_1_ = 1;
            pcVar12 = QTest::toString<bool>((bool *)&local_98);
            pcVar13 = QTest::toString<bool>((bool *)&resolver);
            QTest::compare_helper
                      (bVar7,"Compared values are not the same",pcVar12,pcVar13,"p2.isFulfilled()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x87);
          }
        }
      }
    }
  }
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d920;
  if (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  LOCK();
  (pQVar14->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar14->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar14->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  p1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d920;
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar14 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar14->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar14->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar14->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar14 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar14->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar14->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar14->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::allPromisesSucceed_void()
{
    auto p0 = QtPromise::resolve();
    auto p1 = QtPromise::resolve();
    auto p2 = QtPromise::QPromise<void>{[](const QtPromise::QPromiseResolve<void>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve();
        });
    }};

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<void>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, -1, 42), 42);
    QCOMPARE(p2.isFulfilled(), true);
}